

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O3

void __thiscall Rml::Context::UnfocusDocument(Context *this,ElementDocument *document)

{
  Element **__src;
  __normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  __dest;
  Element *this_00;
  Element **ppEVar1;
  Element **ppEVar2;
  
  __dest = ::std::
           __find_if<__gnu_cxx::__normal_iterator<Rml::Element**,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>,__gnu_cxx::__ops::_Iter_equals_val<Rml::ElementDocument*const>>
                     ((this->document_focus_history).
                      super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
  ppEVar1 = (this->document_focus_history).
            super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar2 = (this->document_focus_history).
            super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (__dest._M_current != ppEVar2) {
    __src = __dest._M_current + 1;
    if (__src != ppEVar2) {
      memmove(__dest._M_current,__src,(long)ppEVar2 - (long)__src);
      ppEVar1 = (this->document_focus_history).
                super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppEVar2 = (this->document_focus_history).
                super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    ppEVar2 = ppEVar2 + -1;
    (this->document_focus_history).
    super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppEVar2;
  }
  if (ppEVar1 != ppEVar2) {
    this_00 = Element::GetFocusLeafNode(ppEVar2[-1]);
    Element::Focus(this_00,false);
  }
  return;
}

Assistant:

void Context::UnfocusDocument(ElementDocument* document)
{
	auto it = std::find(document_focus_history.begin(), document_focus_history.end(), document);
	if (it != document_focus_history.end())
		document_focus_history.erase(it);

	if (!document_focus_history.empty())
		document_focus_history.back()->GetFocusLeafNode()->Focus();
}